

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

TypeRef __thiscall
clickhouse::Type::CreateEnum8
          (Type *this,
          vector<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
          *enum_items)

{
  mapped_type mVar1;
  pointer pEVar2;
  Type *this_00;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  pointer __k;
  TypeRef TVar6;
  
  this_00 = (Type *)operator_new(0x10);
  Type(this_00,Enum8);
  std::__shared_ptr<clickhouse::Type,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Type,void>
            ((__shared_ptr<clickhouse::Type,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  pEVar2 = (enum_items->
           super__Vector_base<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var5._M_pi = extraout_RDX;
  for (__k = (enum_items->
             super__Vector_base<clickhouse::Type::EnumItem,_std::allocator<clickhouse::Type::EnumItem>_>
             )._M_impl.super__Vector_impl_data._M_start; __k != pEVar2; __k = __k + 1) {
    pmVar3 = std::
             map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](*(map<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            **)(*(long *)this + 8),&__k->value);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    mVar1 = __k->value;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                           *)(*(long *)(*(long *)this + 8) + 0x30),&__k->name);
    *pmVar4 = mVar1;
    _Var5._M_pi = extraout_RDX_00;
  }
  TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TypeRef)TVar6.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateEnum8(const std::vector<EnumItem>& enum_items) {
    TypeRef type(new Type(Type::Enum8));
    for (const auto& item : enum_items) {
        type->enum_->value_to_name[item.value] = item.name;
        type->enum_->name_to_value[item.name] = item.value;
    }
    return type;
}